

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigFeed.c
# Opt level: O2

void Fraig_FeedBackCheckTableF0(Fraig_Man_t *p)

{
  Fraig_HashTable_t *pFVar1;
  Fraig_Node_t *Entry;
  int iVar2;
  long lVar3;
  Fraig_NodeVec_t *p_00;
  long lVar4;
  long lVar5;
  Fraig_Node_t **ppFVar6;
  long lVar7;
  
  pFVar1 = p->pTableF0;
  for (lVar3 = 0; lVar3 < pFVar1->nBins; lVar3 = lVar3 + 1) {
    p->vCones->nSize = 0;
    ppFVar6 = pFVar1->pBins + lVar3;
    while( true ) {
      Entry = *ppFVar6;
      p_00 = p->vCones;
      if (Entry == (Fraig_Node_t *)0x0) break;
      Fraig_NodeVecPush(p_00,Entry);
      ppFVar6 = &Entry->pNextF;
    }
    iVar2 = p_00->nSize;
    if (iVar2 != 1) {
      lVar4 = 1;
      for (lVar7 = 0; lVar5 = lVar4, lVar7 < iVar2; lVar7 = lVar7 + 1) {
        for (; (int)lVar5 < iVar2; lVar5 = lVar5 + 1) {
          iVar2 = Fraig_CompareSimInfo(p_00->pArray[lVar7],p_00->pArray[lVar5],p->iWordStart,0);
          if (iVar2 != 0) {
            ppFVar6 = p->vCones->pArray;
            printf("Nodes %d and %d have the same D simulation info.\n",
                   (ulong)(uint)ppFVar6[lVar7]->Num,(ulong)(uint)ppFVar6[lVar5]->Num);
          }
          p_00 = p->vCones;
          iVar2 = p_00->nSize;
        }
        lVar4 = lVar4 + 1;
      }
    }
  }
  return;
}

Assistant:

void Fraig_FeedBackCheckTableF0( Fraig_Man_t * p )
{
    Fraig_HashTable_t * pT = p->pTableF0;
    Fraig_Node_t * pEntF;
    int i, k, m, nPairs;

    nPairs = 0;
    for ( i = 0; i < pT->nBins; i++ )
    {
        p->vCones->nSize = 0;
        Fraig_TableBinForEachEntryF( pT->pBins[i], pEntF )
            Fraig_NodeVecPush( p->vCones, pEntF );
        if ( p->vCones->nSize == 1 )
            continue;
        for ( k = 0; k < p->vCones->nSize; k++ )
            for ( m = k+1; m < p->vCones->nSize; m++ )
            {
                if ( Fraig_CompareSimInfo( p->vCones->pArray[k], p->vCones->pArray[m], p->iWordStart, 0 ) )
                    printf( "Nodes %d and %d have the same D simulation info.\n", 
                        p->vCones->pArray[k]->Num, p->vCones->pArray[m]->Num );
                nPairs++;
            }   
    }
//    printf( "\nThe total of %d node pairs have been verified.\n", nPairs );
}